

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep.c
# Opt level: O3

int splittingStep_SetDefaults(ARKodeMem ark_mem)

{
  int iVar1;
  
  if (ark_mem->step_mem != (void *)0x0) {
    iVar1 = splittingStep_SetOrder(ark_mem,0);
    return iVar1;
  }
  arkProcessError(ark_mem,-0x15,0x20,"splittingStep_SetDefaults",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_splittingstep.c"
                  ,"Time step module memory is NULL.");
  return -0x15;
}

Assistant:

static int splittingStep_AccessStepMem(ARKodeMem ark_mem, const char* fname,
                                       ARKodeSplittingStepMem* step_mem)
{
  if (ark_mem->step_mem == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, fname, __FILE__,
                    "Time step module memory is NULL.");
    return ARK_MEM_NULL;
  }
  *step_mem = (ARKodeSplittingStepMem)ark_mem->step_mem;
  return ARK_SUCCESS;
}